

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buttons.cpp
# Opt level: O0

void __thiscall
GPIO::PushButton::PushButton
          (PushButton *this,uint pin,GPIO_PULL pullupdown,nanoseconds min_trigger_interval,
          nanoseconds min_hold_interval)

{
  function<void_()> *in_RDI;
  GPIO_PULL in_stack_0000000b;
  uint in_stack_0000000c;
  Switch *in_stack_00000010;
  nanoseconds in_stack_00000018;
  nanoseconds in_stack_00000020;
  nullptr_t in_stack_ffffffffffffff88;
  function<void_(std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>)> *this_00;
  function<void_()> *in_stack_ffffffffffffffb0;
  
  Switch::Switch(in_stack_00000010,in_stack_0000000c,in_stack_0000000b,in_stack_00000020,
                 in_stack_00000018);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__PushButton_00143900;
  this_00 = (function<void_(std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>)> *)
            &in_RDI[6]._M_invoker;
  std::function<void_()>::function((function<void_()> *)this_00,in_stack_ffffffffffffff88);
  std::function<void_(std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>)>::function
            (this_00,in_stack_ffffffffffffff88);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)this_00);
  std::function<void()>::operator=(in_stack_ffffffffffffffb0,(anon_class_8_1_8991fb9c *)in_RDI);
  std::function<void()>::operator=(in_RDI,(anon_class_8_1_8991fb9c *)in_RDI);
  return;
}

Assistant:

PushButton::PushButton(unsigned int pin,
                       GPIO_PULL pullupdown,
                       std::chrono::nanoseconds min_trigger_interval,
                       std::chrono::nanoseconds min_hold_interval)
: Switch(pin,
         pullupdown,
         min_trigger_interval,
         min_hold_interval)
{
    // set Switch::f_on with a lambda expression to forward the push event

    f_on = [&]() {
        last_pushed = std::chrono::steady_clock::now();
        if (f_pushed) f_pushed();
    };
    
    // set Switch::f_off with a lambda expression to forward the released event

    f_off = [&]() {
        auto now = std::chrono::steady_clock::now();
        if (f_released) f_released(now - last_pushed);
    };
}